

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitSIMDShuffle(BinaryInstWriter *this,SIMDShuffle *curr)

{
  BufferWithRandomAccess *this_00;
  array<unsigned_char,_16UL> *this_01;
  iterator pvVar1;
  uint8_t m;
  iterator __end1;
  iterator __begin1;
  array<unsigned_char,_16UL> *__range1;
  SIMDShuffle *local_18;
  SIMDShuffle *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (SIMDShuffle *)this;
  this_00 = BufferWithRandomAccess::operator<<(this->o,-3);
  LEB<unsigned_int,_unsigned_char>::LEB
            ((LEB<unsigned_int,_unsigned_char> *)((long)&__range1 + 4),0xd);
  BufferWithRandomAccess::operator<<(this_00,__range1._4_4_);
  this_01 = &local_18->mask;
  __end1 = std::array<unsigned_char,_16UL>::begin(this_01);
  pvVar1 = std::array<unsigned_char,_16UL>::end(this_01);
  for (; __end1 != pvVar1; __end1 = __end1 + 1) {
    BufferWithRandomAccess::operator<<(this->o,*__end1);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitSIMDShuffle(SIMDShuffle* curr) {
  o << int8_t(BinaryConsts::SIMDPrefix) << U32LEB(BinaryConsts::I8x16Shuffle);
  for (uint8_t m : curr->mask) {
    o << m;
  }
}